

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O0

uint64_t labpack_read_u64(labpack_reader_t *reader)

{
  _Bool _Var1;
  uint64_t local_18;
  uint64_t value;
  labpack_reader_t *reader_local;
  
  if (reader == (labpack_reader_t *)0x0) {
    __assert_fail("reader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                  ,0xb8,"uint64_t labpack_read_u64(labpack_reader_t *)");
  }
  local_18 = 0;
  _Var1 = labpack_reader_is_ok(reader);
  if (_Var1) {
    local_18 = mpack_expect_u64(reader->decoder);
    labpack_reader_check_decoder(reader);
  }
  return local_18;
}

Assistant:

uint64_t
labpack_read_u64(labpack_reader_t* reader)
{
    assert(reader);
    uint64_t value = 0;
    if (labpack_reader_is_ok(reader)) {
        value = mpack_expect_u64(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return value;
}